

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O3

void __thiscall MedianFilterCV_8U::filterImageEdges(MedianFilterCV_8U *this,Mat *image)

{
  int iVar1;
  long *plVar2;
  bool bVar3;
  uint uVar4;
  int s;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  int f;
  int iVar11;
  int iVar12;
  uint uVar13;
  uchar __tmp;
  byte *pbVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  byte local_ae [6];
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  long local_98;
  long local_90;
  int local_88 [4];
  uchar uStack_78;
  uchar uStack_77;
  uchar array [6];
  int ranges [4] [4];
  
  local_98 = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = *(int *)(image + 0xc) + -1;
  uStack_78 = '\x01';
  uStack_77 = '\0';
  array[0] = '\0';
  array[1] = '\0';
  array._2_4_ = *(int *)(image + 8) + -1;
  do {
    iVar15 = *(int *)((long)local_88 + local_98);
    lVar9 = (long)iVar15;
    local_a8 = *(int *)((long)local_88 + local_98 + 4);
    if (iVar15 <= local_a8) {
      iVar12 = *(int *)((long)local_88 + local_98 + 8);
      iVar1 = *(int *)((long)local_88 + local_98 + 0xc);
      local_90 = (long)iVar12;
      local_a0 = iVar12 + -1;
      local_a4 = iVar15 + -1;
      local_9c = iVar1 + 1;
      local_a8 = local_a8 + 1;
      do {
        if ((int)local_90 <= iVar1) {
          lVar6 = (long)local_a4;
          lVar18 = local_90;
          iVar15 = local_a0;
          do {
            local_ae[4] = 0;
            local_ae[5] = 0xff;
            iVar12 = *(int *)(image + 8);
            iVar5 = *(int *)(image + 0xc);
            lVar7 = *(long *)(image + 0x10);
            plVar2 = *(long **)(image + 0x48);
            iVar11 = 0;
            lVar16 = (long)iVar15;
            lVar17 = lVar6;
            do {
              if (((-1 < (int)((uint)lVar16 | (uint)lVar17)) && (lVar17 < iVar12)) &&
                 (lVar16 < iVar5)) {
                lVar8 = (long)iVar11;
                iVar11 = iVar11 + 1;
                local_ae[lVar8] = *(byte *)(lVar16 + *plVar2 * lVar17 + lVar7);
              }
              bVar3 = lVar16 <= lVar18;
              lVar16 = lVar16 + 1;
            } while ((bVar3) ||
                    (bVar3 = lVar17 <= lVar9, lVar16 = (long)iVar15, lVar17 = lVar17 + 1, bVar3));
            lVar7 = 0x28;
            do {
              iVar12 = *(int *)(this->firstTempArray + lVar7 + -0x18);
              bVar10 = local_ae[*(int *)(this->firstTempArray + lVar7 + -0x1c)];
              if (local_ae[iVar12] < bVar10) {
                local_ae[*(int *)(this->firstTempArray + lVar7 + -0x1c)] = local_ae[iVar12];
                local_ae[iVar12] = bVar10;
              }
              lVar7 = lVar7 + 8;
            } while (lVar7 != 0x40);
            lVar7 = 0x28;
            do {
              iVar12 = *(int *)(this->firstTempArray + lVar7 + -0x18);
              bVar10 = local_ae[(long)*(int *)(this->firstTempArray + lVar7 + -0x1c) + 3];
              if (local_ae[(long)iVar12 + 3] < bVar10) {
                local_ae[(long)*(int *)(this->firstTempArray + lVar7 + -0x1c) + 3] =
                     local_ae[(long)iVar12 + 3];
                local_ae[(long)iVar12 + 3] = bVar10;
              }
              lVar7 = lVar7 + 8;
            } while (lVar7 != 0x40);
            iVar5 = 0;
            lVar7 = 4;
            iVar12 = 0;
            do {
              if ((iVar5 == 3) || ((iVar12 != 3 && (local_ae[iVar12] < local_ae[(long)iVar5 + 3]))))
              {
                pbVar14 = local_ae + iVar12;
                iVar12 = iVar12 + 1;
              }
              else {
                pbVar14 = local_ae + (long)iVar5 + 3;
                iVar5 = iVar5 + 1;
              }
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
            bVar10 = *(byte *)(lVar18 + **(long **)(this->sourceImage + 0x48) * lVar9 +
                                        *(long *)(this->sourceImage + 0x10));
            uVar13 = (uint)bVar10 - (uint)*pbVar14;
            uVar4 = -uVar13;
            if (0 < (int)uVar13) {
              uVar4 = uVar13;
            }
            if ((uint)this->threshold < (uVar4 & 0xff)) {
              bVar10 = *pbVar14;
            }
            *(byte *)(lVar18 + **(long **)(this->resultImage + 0x48) * lVar9 +
                               *(long *)(this->resultImage + 0x10)) = bVar10;
            lVar18 = lVar18 + 1;
            iVar15 = iVar15 + 1;
          } while (local_9c != (int)lVar18);
        }
        lVar9 = lVar9 + 1;
        local_a4 = local_a4 + 1;
      } while (local_a8 != (int)lVar9);
    }
    local_98 = local_98 + 0x10;
  } while (local_98 != 0x40);
  return;
}

Assistant:

void MedianFilterCV_8U::filterImageEdges(const cv::Mat &image) {


    // Array of ranges to filter. Each range consists of two pairs.
    // The first and second is a range in y, third and fourth is a range in x.
    // For example {0, 0, 0, image.cols - 1} range specifying the first line
    int ranges[4][4] = {{0, 0, 0, image.cols - 1},
                        {1, image.rows - 1, 0, 0},
                        {image.rows - 1, image.rows - 1, 0, image.cols - 1},
                        {1, image.rows - 1, image.cols - 1, image.cols - 1}}; // 42 operations


    uchar tempMedian;                                                         // 1 operations
    // if first or last line (len = 1920)  (1 + 2 + 4 + 2 + 4 * 1920 + 1920 * (1 + 4 + 1 + 14 + 14 + ~80 + 63)) * 2 = 695052
    // if the first or last column (hei = 1080) (1 + 2 + 4 + 2 + 4 * 1078 + 1078 * (1 + 4 + 1 + 14 + 14 + ~80 + 63)) * 2 = 390254
    for (auto range : ranges) {                                               // 4 operations
        int position = 0;                                                     // 1 operation
        for (int y = range[0]; y <= range[1]; ++y) {                          // 2 operations + 4 at every step
            for (int x = range[2]; x <= range[3]; ++x) {                      // 2 operations + 4 at every step
                uchar array[6];                                               // 1 operation
                // Add 0 and 255 in case we are looking for a median in the corners.
                // Thus we process corner pixels as well as non-corner pixels
                array[4] = 0;                                                 // 2 operations
                array[5] = 255;                                               // 2 operations

                position = 0;                                                 // 1 operation
                for (int i = y - 1; i <= y + 1; ++i) {                        // 2 operations + 12
                    for (int j = x - 1; j <= x + 1; ++j) {                    // 2 operations + 12
                        if (i < 0 || j < 0 || i >= image.rows || j >= image.cols) { // 9 operations
                            continue;                                         // 1 operation
                        }

                        array[position++] = image.at<uchar>(i, j);            // 7 operations
                    }
                }

                // sort the first 3 and last 3 elements
                sortThreeElements(array);                                     // 1 operation + operations of sort
                sortThreeElements(array + 3);                                 // 2 operations + operations of sort

                tempMedian = getMedianOfTwoSortedArray(array, 3, array + 3, 3);// 3 operations
                resultImage->at<uchar>(y, x) = getActualPixel(tempMedian, y, x);// 3 operations
            }
        }
    }
}